

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PCachePercentDirty(PCache *pCache)

{
  int iVar1;
  PCache *in_RDI;
  int nCache;
  int nDirty;
  PgHdr *pDirty;
  int local_1c;
  int local_14;
  PgHdr *local_10;
  
  local_14 = 0;
  iVar1 = numberOfCachePages(in_RDI);
  for (local_10 = in_RDI->pDirty; local_10 != (PgHdr *)0x0; local_10 = local_10->pDirtyNext) {
    local_14 = local_14 + 1;
  }
  if (iVar1 == 0) {
    local_1c = 0;
  }
  else {
    local_1c = (int)(((long)local_14 * 100) / (long)iVar1);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3PCachePercentDirty(PCache *pCache){
  PgHdr *pDirty;
  int nDirty = 0;
  int nCache = numberOfCachePages(pCache);
  for(pDirty=pCache->pDirty; pDirty; pDirty=pDirty->pDirtyNext) nDirty++;
  return nCache ? (int)(((i64)nDirty * 100) / nCache) : 0;
}